

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# misc.c
# Opt level: O3

void titlepic(void)

{
  byte bVar1;
  int iVar2;
  uint uVar3;
  FILE *__stream;
  uint cord;
  short sVar4;
  int iVar5;
  ulong uVar6;
  uint cord_00;
  long lVar7;
  
  __stream = fopen("data/title.bmp","rb");
  if (__stream == (FILE *)0x0) {
    printf("Titlepic fileopen Error");
    coniogetch();
    exit(1);
  }
  bVar1 = peekb(0x40,0x17);
  pokeb(0x40,0x17,bVar1 | 0x40);
  lVar7 = 0x8000;
  do {
    iVar2 = getc(__stream);
    *(char *)((long)&output + lVar7 + 7) = (char)iVar2;
    lVar7 = lVar7 + -1;
  } while (lVar7 != 0);
  iVar2 = 0;
  iVar5 = 0;
  do {
    setrgbpalette(iVar5,iVar2,iVar2,iVar2);
    setpalette((ubyte)iVar5,(ubyte)iVar5);
    iVar5 = iVar5 + 1;
    iVar2 = iVar2 + 4;
  } while (iVar5 != 0x10);
  cord = 0;
  setrgbpalette(0xf,0x3f,0,0);
  setpalette('\x0f','\x0f');
  uVar6 = 0x28a;
  uVar3 = 0;
  do {
    sVar4 = cord - ((uVar3 & 3) == 0);
    cord = sVar4 + 2;
    cord_00 = sVar4 + 1;
    iVar2 = 0;
    do {
      sVar4 = (short)iVar2;
      uVar6 = uVar6 & 0xffff;
      putpixel(sVar4 + 0x280U,cord,(uint)(pic_temp_ram[uVar6] >> 4));
      putpixel(sVar4 + 0x281U,cord,(uint)(pic_temp_ram[uVar6] >> 4));
      putpixel(sVar4 + 0x282U,cord,pic_temp_ram[uVar6] & 0xf);
      putpixel(sVar4 + 0x283U,cord,pic_temp_ram[uVar6] & 0xf);
      if ((uVar3 & 3) != 0) {
        putpixel(sVar4 + 0x280U,cord_00,(uint)(pic_temp_ram[uVar6] >> 4));
        putpixel(sVar4 + 0x281U,cord_00,(uint)(pic_temp_ram[uVar6] >> 4));
        putpixel(sVar4 + 0x282U,cord_00,pic_temp_ram[uVar6] & 0xf);
        putpixel(sVar4 + 0x283U,cord_00,pic_temp_ram[uVar6] & 0xf);
      }
      iVar5 = kbhit();
      if (iVar5 != 0) goto LAB_0010b7e8;
      uVar6 = (ulong)((int)uVar6 + 1);
      iVar2 = iVar2 + -4;
    } while (iVar2 != -0x280);
    uVar3 = uVar3 + 1;
  } while (uVar3 != 200);
  setrgbpalette(0xf,0x3f,4,0);
  setpalette('\x0f','\x0f');
  delay(10);
LAB_0010b7e8:
  coniogetch();
  return;
}

Assistant:

void titlepic(void) {                     // the title picture display
    // display function
    int horz, vert;
    int vvert = 0;
    uint c, d = 0;
    uint red = 63, green = 0, blue = 0;

    FILE *title;

    if ((title = fopen("data/title.bmp", "rb")) == NULL) {
        printf("Titlepic fileopen Error");
        coniogetch();                            // open the picture file
        exit(1);
    };

    pokeb(0x0040, 0x0017, peekb(0x0040, 0x0017) | 0x40); // turn on capslock

    for (c = 0x8000; c; c--) {                          // load the picture
        pic_temp_ram[c - 1] = getc(title);
    }

    for (c = 0; c < 16; c++) {                            // initialise the palette
        setrgbpalette(c, c << 2, c << 2, c << 2);             // for greyscale
        setpalette(c, c);
    }

    setrgbpalette(15, 63, 0, 0);                       // set the red colour
    setpalette(15, 15);

    for (vert = 0, c = 650; vert < 200; vert++) {            // loop through each
        vvert++;                                     // pixel row

        if (vert & 0x3) vvert++;                       // scale output to fit
        // screen
        for (horz = 640; horz; horz -= 4, c++) {

            putpixel(horz + 0, vvert, pic_temp_ram[c] >> 4);
            putpixel(horz + 1, vvert, pic_temp_ram[c] >> 4);
            putpixel(horz + 2, vvert, pic_temp_ram[c] & 0xF);
            putpixel(horz + 3, vvert, pic_temp_ram[c] & 0xF);

            if (vert & 0x3) { // if y cord has been scaled, draw on original line
                vvert--;
                putpixel(horz + 0, vvert, pic_temp_ram[c] >> 4);
                putpixel(horz + 1, vvert, pic_temp_ram[c] >> 4);
                putpixel(horz + 2, vvert, pic_temp_ram[c] & 0xF);
                putpixel(horz + 3, vvert, pic_temp_ram[c] & 0xF);
                vvert++;
            }
            if (kbhit()) {
                coniogetch();
                return;
            }  // wait for keypress
        }
    }

    for (; ;)                             // cycle colours until
        for (c = 0; c <= 4; c++)
            for (d = 0; d < 15; d++) {
                switch (c) {
                    case 0:
                        green += 4;
                        break;
                    case 1:
                        red -= 4;
                        break;
                    case 2:
                        blue += 4;
                        break;
                    case 3:
                        green -= 4;
                        break;
                    case 4:
                        blue -= 4;
                        red += 4;
                        break;
                }
                setrgbpalette(15, red, green, blue);
                setpalette(15, 15);
                delay(10);                        // delay deliberately
                if (1 /*kbhit() */) {   // TODO no point waiting for press any key to continue
                    coniogetch();
                    return;
                }   // until keypressed
            }
}